

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infcodes.c
# Opt level: O0

int inflate_codes(inflate_blocks_statef *s,z_streamp z,int r)

{
  byte bVar1;
  undefined4 *puVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  inflate_codes_statef *piVar6;
  int local_b8;
  int local_b0;
  int local_a8;
  int local_a0;
  int local_98;
  int local_90;
  int local_80;
  inflate_codes_statef *c;
  Bytef *f;
  Bytef *pBStack_60;
  uInt m;
  Bytef *q;
  byte *pbStack_50;
  uInt n;
  Bytef *p;
  ulong uStack_40;
  uInt k;
  uLong b;
  uInt e;
  inflate_huft *t;
  uInt j;
  int r_local;
  z_streamp z_local;
  inflate_blocks_statef *s_local;
  
  puVar2 = *(undefined4 **)&s->sub;
  pbStack_50 = z->next_in;
  q._4_4_ = z->avail_in;
  uStack_40 = s->bitb;
  p._4_4_ = s->bitk;
  pBStack_60 = s->write;
  if (pBStack_60 < s->read) {
    local_80 = ((int)s->read - (int)pBStack_60) + -1;
  }
  else {
    local_80 = (int)s->end - (int)pBStack_60;
  }
  f._4_4_ = local_80;
  t._4_4_ = r;
  do {
    switch(*puVar2) {
    case 0:
      puVar2[4] = (uint)*(byte *)(puVar2 + 6);
      *(undefined8 *)(puVar2 + 2) = *(undefined8 *)(puVar2 + 8);
      *puVar2 = 1;
    case 1:
      for (; p._4_4_ < (uint)puVar2[4]; p._4_4_ = p._4_4_ + 8) {
        if (q._4_4_ == 0) {
          s->bitb = uStack_40;
          s->bitk = p._4_4_;
          z->avail_in = 0;
          z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
          z->next_in = pbStack_50;
          s->write = pBStack_60;
          iVar4 = inflate_flush(s,z,t._4_4_);
          return iVar4;
        }
        t._4_4_ = 0;
        q._4_4_ = q._4_4_ - 1;
        uStack_40 = (ulong)*pbStack_50 << ((byte)p._4_4_ & 0x3f) | uStack_40;
        pbStack_50 = pbStack_50 + 1;
      }
      pbVar5 = (byte *)(*(long *)(puVar2 + 2) +
                       (ulong)((uint)uStack_40 & inflate_mask[(uint)puVar2[4]]) * 8);
      uStack_40 = uStack_40 >> (pbVar5[1] & 0x3f);
      p._4_4_ = p._4_4_ - pbVar5[1];
      bVar1 = *pbVar5;
      uVar3 = (uint)bVar1;
      if (uVar3 == 0) {
        puVar2[2] = *(undefined4 *)(pbVar5 + 4);
        *puVar2 = 6;
      }
      else if ((bVar1 & 0x10) == 0) {
        if ((bVar1 & 0x40) == 0) {
          puVar2[4] = uVar3;
          *(byte **)(puVar2 + 2) = pbVar5 + (ulong)*(uint *)(pbVar5 + 4) * 8;
        }
        else {
          if ((bVar1 & 0x20) == 0) {
            *puVar2 = 9;
            z->msg = "invalid literal/length code";
            s->bitb = uStack_40;
            s->bitk = p._4_4_;
            z->avail_in = q._4_4_;
            z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
            z->next_in = pbStack_50;
            s->write = pBStack_60;
            iVar4 = inflate_flush(s,z,-3);
            return iVar4;
          }
          *puVar2 = 7;
        }
      }
      else {
        puVar2[2] = uVar3 & 0xf;
        puVar2[1] = *(undefined4 *)(pbVar5 + 4);
        *puVar2 = 2;
      }
      break;
    case 2:
      uVar3 = puVar2[2];
      for (; p._4_4_ < uVar3; p._4_4_ = p._4_4_ + 8) {
        if (q._4_4_ == 0) {
          s->bitb = uStack_40;
          s->bitk = p._4_4_;
          z->avail_in = 0;
          z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
          z->next_in = pbStack_50;
          s->write = pBStack_60;
          iVar4 = inflate_flush(s,z,t._4_4_);
          return iVar4;
        }
        t._4_4_ = 0;
        q._4_4_ = q._4_4_ - 1;
        uStack_40 = (ulong)*pbStack_50 << ((byte)p._4_4_ & 0x3f) | uStack_40;
        pbStack_50 = pbStack_50 + 1;
      }
      puVar2[1] = ((uint)uStack_40 & inflate_mask[uVar3]) + puVar2[1];
      uStack_40 = uStack_40 >> ((byte)uVar3 & 0x3f);
      p._4_4_ = p._4_4_ - uVar3;
      puVar2[4] = (uint)*(byte *)((long)puVar2 + 0x19);
      *(undefined8 *)(puVar2 + 2) = *(undefined8 *)(puVar2 + 10);
      *puVar2 = 3;
    case 3:
      for (; p._4_4_ < (uint)puVar2[4]; p._4_4_ = p._4_4_ + 8) {
        if (q._4_4_ == 0) {
          s->bitb = uStack_40;
          s->bitk = p._4_4_;
          z->avail_in = 0;
          z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
          z->next_in = pbStack_50;
          s->write = pBStack_60;
          iVar4 = inflate_flush(s,z,t._4_4_);
          return iVar4;
        }
        t._4_4_ = 0;
        q._4_4_ = q._4_4_ - 1;
        uStack_40 = (ulong)*pbStack_50 << ((byte)p._4_4_ & 0x3f) | uStack_40;
        pbStack_50 = pbStack_50 + 1;
      }
      pbVar5 = (byte *)(*(long *)(puVar2 + 2) +
                       (ulong)((uint)uStack_40 & inflate_mask[(uint)puVar2[4]]) * 8);
      uStack_40 = uStack_40 >> (pbVar5[1] & 0x3f);
      p._4_4_ = p._4_4_ - pbVar5[1];
      bVar1 = *pbVar5;
      if ((bVar1 & 0x10) == 0) {
        if ((bVar1 & 0x40) != 0) {
          *puVar2 = 9;
          z->msg = "invalid distance code";
          s->bitb = uStack_40;
          s->bitk = p._4_4_;
          z->avail_in = q._4_4_;
          z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
          z->next_in = pbStack_50;
          s->write = pBStack_60;
          iVar4 = inflate_flush(s,z,-3);
          return iVar4;
        }
        puVar2[4] = (uint)bVar1;
        *(byte **)(puVar2 + 2) = pbVar5 + (ulong)*(uint *)(pbVar5 + 4) * 8;
      }
      else {
        puVar2[2] = bVar1 & 0xf;
        puVar2[3] = *(undefined4 *)(pbVar5 + 4);
        *puVar2 = 4;
      }
      break;
    case 4:
      uVar3 = puVar2[2];
      for (; p._4_4_ < uVar3; p._4_4_ = p._4_4_ + 8) {
        if (q._4_4_ == 0) {
          s->bitb = uStack_40;
          s->bitk = p._4_4_;
          z->avail_in = 0;
          z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
          z->next_in = pbStack_50;
          s->write = pBStack_60;
          iVar4 = inflate_flush(s,z,t._4_4_);
          return iVar4;
        }
        t._4_4_ = 0;
        q._4_4_ = q._4_4_ - 1;
        uStack_40 = (ulong)*pbStack_50 << ((byte)p._4_4_ & 0x3f) | uStack_40;
        pbStack_50 = pbStack_50 + 1;
      }
      puVar2[3] = ((uint)uStack_40 & inflate_mask[uVar3]) + puVar2[3];
      uStack_40 = uStack_40 >> ((byte)uVar3 & 0x3f);
      p._4_4_ = p._4_4_ - uVar3;
      *puVar2 = 5;
    case 5:
      for (c = (inflate_codes_statef *)(pBStack_60 + -(ulong)(uint)puVar2[3]);
          c < (inflate_codes_statef *)s->window;
          c = (inflate_codes_statef *)(((long)s->end - (long)s->window) + (long)c)) {
      }
      while (puVar2[1] != 0) {
        if (f._4_4_ == 0) {
          if ((pBStack_60 == s->end) && (s->read != s->window)) {
            pBStack_60 = s->window;
            if (pBStack_60 < s->read) {
              local_90 = ((int)s->read - (int)pBStack_60) + -1;
            }
            else {
              local_90 = (int)s->end - (int)pBStack_60;
            }
            f._4_4_ = local_90;
          }
          if (f._4_4_ == 0) {
            s->write = pBStack_60;
            iVar4 = inflate_flush(s,z,t._4_4_);
            pBStack_60 = s->write;
            if (pBStack_60 < s->read) {
              local_98 = ((int)s->read - (int)pBStack_60) + -1;
            }
            else {
              local_98 = (int)s->end - (int)pBStack_60;
            }
            f._4_4_ = local_98;
            if ((pBStack_60 == s->end) && (s->read != s->window)) {
              pBStack_60 = s->window;
              if (pBStack_60 < s->read) {
                local_a0 = ((int)s->read - (int)pBStack_60) + -1;
              }
              else {
                local_a0 = (int)s->end - (int)pBStack_60;
              }
              f._4_4_ = local_a0;
            }
            if (f._4_4_ == 0) {
              s->bitb = uStack_40;
              s->bitk = p._4_4_;
              z->avail_in = q._4_4_;
              z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
              z->next_in = pbStack_50;
              s->write = pBStack_60;
              iVar4 = inflate_flush(s,z,iVar4);
              return iVar4;
            }
          }
        }
        t._4_4_ = 0;
        piVar6 = (inflate_codes_statef *)((long)&c->mode + 1);
        *pBStack_60 = (char)c->mode;
        f._4_4_ = f._4_4_ + -1;
        c = piVar6;
        if (piVar6 == (inflate_codes_statef *)s->end) {
          c = (inflate_codes_statef *)s->window;
        }
        puVar2[1] = puVar2[1] + -1;
        pBStack_60 = pBStack_60 + 1;
      }
      *puVar2 = 0;
      break;
    case 6:
      if (f._4_4_ == 0) {
        if ((pBStack_60 == s->end) && (s->read != s->window)) {
          pBStack_60 = s->window;
          if (pBStack_60 < s->read) {
            local_a8 = ((int)s->read - (int)pBStack_60) + -1;
          }
          else {
            local_a8 = (int)s->end - (int)pBStack_60;
          }
          f._4_4_ = local_a8;
        }
        if (f._4_4_ == 0) {
          s->write = pBStack_60;
          iVar4 = inflate_flush(s,z,t._4_4_);
          pBStack_60 = s->write;
          if (pBStack_60 < s->read) {
            local_b0 = ((int)s->read - (int)pBStack_60) + -1;
          }
          else {
            local_b0 = (int)s->end - (int)pBStack_60;
          }
          f._4_4_ = local_b0;
          if ((pBStack_60 == s->end) && (s->read != s->window)) {
            pBStack_60 = s->window;
            if (pBStack_60 < s->read) {
              local_b8 = ((int)s->read - (int)pBStack_60) + -1;
            }
            else {
              local_b8 = (int)s->end - (int)pBStack_60;
            }
            f._4_4_ = local_b8;
          }
          if (f._4_4_ == 0) {
            s->bitb = uStack_40;
            s->bitk = p._4_4_;
            z->avail_in = q._4_4_;
            z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
            z->next_in = pbStack_50;
            s->write = pBStack_60;
            iVar4 = inflate_flush(s,z,iVar4);
            return iVar4;
          }
        }
      }
      t._4_4_ = 0;
      *pBStack_60 = (Bytef)puVar2[2];
      f._4_4_ = f._4_4_ + -1;
      *puVar2 = 0;
      pBStack_60 = pBStack_60 + 1;
      break;
    case 7:
      if (7 < p._4_4_) {
        p._4_4_ = p._4_4_ - 8;
        q._4_4_ = q._4_4_ + 1;
        pbStack_50 = pbStack_50 + -1;
      }
      s->write = pBStack_60;
      iVar4 = inflate_flush(s,z,t._4_4_);
      pBStack_60 = s->write;
      if (s->read == s->write) {
        *puVar2 = 8;
switchD_0036a970_caseD_8:
        s->bitb = uStack_40;
        s->bitk = p._4_4_;
        z->avail_in = q._4_4_;
        z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
        z->next_in = pbStack_50;
        s->write = pBStack_60;
        s_local._4_4_ = inflate_flush(s,z,1);
      }
      else {
        s->bitb = uStack_40;
        s->bitk = p._4_4_;
        z->avail_in = q._4_4_;
        z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
        z->next_in = pbStack_50;
        s->write = pBStack_60;
        s_local._4_4_ = inflate_flush(s,z,iVar4);
      }
      return s_local._4_4_;
    case 8:
      goto switchD_0036a970_caseD_8;
    case 9:
      s->bitb = uStack_40;
      s->bitk = p._4_4_;
      z->avail_in = q._4_4_;
      z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
      z->next_in = pbStack_50;
      s->write = pBStack_60;
      iVar4 = inflate_flush(s,z,-3);
      return iVar4;
    default:
      s->bitb = uStack_40;
      s->bitk = p._4_4_;
      z->avail_in = q._4_4_;
      z->total_in = (uLong)(pbStack_50 + (z->total_in - (long)z->next_in));
      z->next_in = pbStack_50;
      s->write = pBStack_60;
      iVar4 = inflate_flush(s,z,-2);
      return iVar4;
    }
  } while( true );
}

Assistant:

local int inflate_codes( /* s, z, r) */
inflate_blocks_statef *s,
z_streamp z,
int r )
{
  uInt j;               /* temporary storage */
  inflate_huft *t;      /* temporary pointer */
  uInt e;               /* extra bits or operation */
  uLong b;              /* bit buffer */
  uInt k;               /* bits in bit buffer */
  Bytef *p;             /* input data pointer */
  uInt n;               /* bytes available there */
  Bytef *q;             /* output window write pointer */
  uInt m;               /* bytes to end of window or read pointer */
  Bytef *f;             /* pointer to copy strings from */
  inflate_codes_statef *c = s->sub.decode.codes;  /* codes state */

  /* copy input/output information to locals (UPDATE macro restores) */
  LOAD

  /* process input and output based on current state */
  while (1) switch (c->mode)
  {             /* waiting for "i:"=input, "o:"=output, "x:"=nothing */
    case START:         /* x: set up for LEN */
#ifndef SLOW
      if (m >= 258 && n >= 10)
      {
        UPDATE
        r = inflate_fast(c->lbits, c->dbits, c->ltree, c->dtree, s, z);
        LOAD
        if (r != Z_OK)
        {
          c->mode = r == Z_STREAM_END ? WASH : BADCODE;
          break;
        }
      }
#endif /* !SLOW */
      c->sub.code.need = c->lbits;
      c->sub.code.tree = c->ltree;
      c->mode = LEN;
    case LEN:           /* i: get length/literal/eob next */
      j = c->sub.code.need;
      NEEDBITS(j)
      t = c->sub.code.tree + ((uInt)b & inflate_mask[j]);
      DUMPBITS(t->bits)
      e = (uInt)(t->exop);
      if (e == 0)               /* literal */
      {
        c->sub.lit = t->base;
        Tracevv((stderr, t->base >= 0x20 && t->base < 0x7f ?
                 "inflate:         literal '%c'\n" :
                 "inflate:         literal 0x%02x\n", t->base));
        c->mode = LIT;
        break;
      }
      if (e & 16)               /* length */
      {
        c->sub.copy.get = e & 15;
        c->len = t->base;
        c->mode = LENEXT;
        break;
      }
      if ((e & 64) == 0)        /* next table */
      {
        c->sub.code.need = e;
        c->sub.code.tree = t + t->base;
        break;
      }
      if (e & 32)               /* end of block */
      {
        Tracevv((stderr, "inflate:         end of block\n"));
        c->mode = WASH;
        break;
      }
      c->mode = BADCODE;        /* invalid code */
      z->msg = (char*)"invalid literal/length code";
      r = Z_DATA_ERROR;
      LEAVE
    case LENEXT:        /* i: getting length extra (have base) */
      j = c->sub.copy.get;
      NEEDBITS(j)
      c->len += (uInt)b & inflate_mask[j];
      DUMPBITS(j)
      c->sub.code.need = c->dbits;
      c->sub.code.tree = c->dtree;
      Tracevv((stderr, "inflate:         length %u\n", c->len));
      c->mode = DIST;
    case DIST:          /* i: get distance next */
      j = c->sub.code.need;
      NEEDBITS(j)
      t = c->sub.code.tree + ((uInt)b & inflate_mask[j]);
      DUMPBITS(t->bits)
      e = (uInt)(t->exop);
      if (e & 16)               /* distance */
      {
        c->sub.copy.get = e & 15;
        c->sub.copy.dist = t->base;
        c->mode = DISTEXT;
        break;
      }
      if ((e & 64) == 0)        /* next table */
      {
        c->sub.code.need = e;
        c->sub.code.tree = t + t->base;
        break;
      }
      c->mode = BADCODE;        /* invalid code */
      z->msg = (char*)"invalid distance code";
      r = Z_DATA_ERROR;
      LEAVE
    case DISTEXT:       /* i: getting distance extra */
      j = c->sub.copy.get;
      NEEDBITS(j)
      c->sub.copy.dist += (uInt)b & inflate_mask[j];
      DUMPBITS(j)
      Tracevv((stderr, "inflate:         distance %u\n", c->sub.copy.dist));
      c->mode = COPY;
    case COPY:          /* o: copying bytes in window, waiting for space */
      f = q - c->sub.copy.dist;
      while (f < s->window)             /* modulo window size-"while" instead */
        f += s->end - s->window;        /* of "if" handles invalid distances */
      while (c->len)
      {
        NEEDOUT
        OUTBYTE(*f++)
        if (f == s->end)
          f = s->window;
        c->len--;
      }
      c->mode = START;
      break;
    case LIT:           /* o: got literal, waiting for output space */
      NEEDOUT
      OUTBYTE(c->sub.lit)
      c->mode = START;
      break;
    case WASH:          /* o: got eob, possibly more output */
      if (k > 7)        /* return unused byte, if any */
      {
        Assert(k < 16, "inflate_codes grabbed too many bytes")
        k -= 8;
        n++;
        p--;            /* can always return one */
      }
      FLUSH
      if (s->read != s->write)
        LEAVE
      c->mode = END;
    case END:
      r = Z_STREAM_END;
      LEAVE
    case BADCODE:       /* x: got error */
      r = Z_DATA_ERROR;
      LEAVE
    default:
      r = Z_STREAM_ERROR;
      LEAVE
  }
#ifdef NEED_DUMMY_RETURN
  return Z_STREAM_ERROR;  /* Some dumb compilers complain without this */
#endif
}